

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

string * common_params_get_system_info_abi_cxx11_
                   (string *__return_storage_ptr__,common_params *params)

{
  ostream *poVar1;
  char *pcVar2;
  ostringstream os;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"system_info: n_threads = ");
  std::ostream::operator<<(poVar1,(params->cpuparams).n_threads);
  if ((params->cpuparams_batch).n_threads != -1) {
    poVar1 = std::operator<<((ostream *)local_190," (n_threads_batch = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(params->cpuparams_batch).n_threads);
    std::operator<<(poVar1,")");
  }
  poVar1 = std::operator<<((ostream *)local_190," / ");
  std::thread::hardware_concurrency();
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," | ");
  pcVar2 = (char *)llama_print_system_info();
  std::operator<<(poVar1,pcVar2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string common_params_get_system_info(const common_params & params) {
    std::ostringstream os;

    os << "system_info: n_threads = " << params.cpuparams.n_threads;
    if (params.cpuparams_batch.n_threads != -1) {
        os << " (n_threads_batch = " << params.cpuparams_batch.n_threads << ")";
    }
#if defined(_WIN32) && (_WIN32_WINNT >= 0x0601) && !defined(__MINGW64__) // windows 7 and later
    // TODO: windows + arm64 + mingw64
    DWORD logicalProcessorCount = GetActiveProcessorCount(ALL_PROCESSOR_GROUPS);
    os << " / " << logicalProcessorCount << " | " << llama_print_system_info();
#else
    os << " / " << std::thread::hardware_concurrency() << " | " << llama_print_system_info();
#endif

    return os.str();
}